

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall SQVM::CMP_OP(SQVM *this,CmpOP op,SQObjectPtr *o1,SQObjectPtr *o2,SQObjectPtr *res)

{
  bool bVar1;
  SQObjectPtr *this_00;
  uint in_ESI;
  SQInteger *unaff_retaddr;
  SQObjectPtr *in_stack_00000008;
  SQInteger r;
  undefined7 in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffbf;
  bool local_1;
  
  bVar1 = ObjCmp((SQVM *)res,(SQObjectPtr *)r,in_stack_00000008,unaff_retaddr);
  if (bVar1) {
    this_00 = (SQObjectPtr *)(ulong)in_ESI;
    switch(this_00) {
    case (SQObjectPtr *)0x0:
      ::SQObjectPtr::operator=(this_00,(bool)in_stack_ffffffffffffffbf);
      local_1 = true;
      break;
    default:
      goto LAB_00143c2e;
    case (SQObjectPtr *)0x2:
      ::SQObjectPtr::operator=(this_00,(bool)in_stack_ffffffffffffffbf);
      local_1 = true;
      break;
    case (SQObjectPtr *)0x3:
      ::SQObjectPtr::operator=(this_00,(bool)in_stack_ffffffffffffffbf);
      local_1 = true;
      break;
    case (SQObjectPtr *)0x4:
      ::SQObjectPtr::operator=(this_00,(bool)in_stack_ffffffffffffffbf);
      local_1 = true;
      break;
    case (SQObjectPtr *)0x5:
      ::SQObjectPtr::operator=
                (this_00,CONCAT17(in_stack_ffffffffffffffbf,in_stack_ffffffffffffffb8));
      local_1 = true;
    }
  }
  else {
LAB_00143c2e:
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SQVM::CMP_OP(CmpOP op, const SQObjectPtr &o1,const SQObjectPtr &o2,SQObjectPtr &res)
{
    SQInteger r;
    if(ObjCmp(o1,o2,r)) {
        switch(op) {
            case CMP_G: res = (r > 0); return true;
            case CMP_GE: res = (r >= 0); return true;
            case CMP_L: res = (r < 0); return true;
            case CMP_LE: res = (r <= 0); return true;
            case CMP_3W: res = r; return true;
        }
        assert(0);
    }
    return false;
}